

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region_fwd.hpp
# Opt level: O1

void __thiscall toml::detail::region::region(region *this,region *param_1)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer pcVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  
  (this->source_).
  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (param_1->source_).
            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  p_Var1 = (param_1->source_).
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->source_).
  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->source_name_)._M_dataplus._M_p = (pointer)&(this->source_name_).field_2;
  pcVar2 = (param_1->source_name_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->source_name_,pcVar2,pcVar2 + (param_1->source_name_)._M_string_length)
  ;
  this->last_column_ = param_1->last_column_;
  sVar3 = param_1->length_;
  sVar4 = param_1->first_;
  sVar5 = param_1->first_line_;
  sVar6 = param_1->first_column_;
  sVar7 = param_1->last_line_;
  this->last_ = param_1->last_;
  this->last_line_ = sVar7;
  this->first_line_ = sVar5;
  this->first_column_ = sVar6;
  this->length_ = sVar3;
  this->first_ = sVar4;
  return;
}

Assistant:

region(const region&) = default;